

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O0

void __thiscall wasm::Fuzzer::checkCanonicalization(Fuzzer *this)

{
  Printed PVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  bool bVar4;
  size_type sVar5;
  Fatal *pFVar6;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  size_type sVar7;
  __node_base_ptr p_Var8;
  reference pvVar9;
  reference other;
  ostream *poVar10;
  undefined8 in_stack_fffffffffffff918;
  undefined8 in_stack_fffffffffffff920;
  undefined8 in_stack_fffffffffffff928;
  undefined8 in_stack_fffffffffffff930;
  _Invoker_type in_stack_fffffffffffff938;
  Printed local_608;
  char local_5d9;
  uintptr_t local_5d8;
  Printed local_5d0;
  Fatal local_5a8;
  uintptr_t local_420;
  Printed local_418;
  ulong local_3f0;
  size_t j;
  string local_3e0;
  undefined1 local_3c0 [8];
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> print_1;
  size_t i;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> newTypes;
  allocator<char> local_179;
  string local_178;
  undefined1 local_158 [8];
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> print;
  Error *error;
  BuildResult result;
  Copier local_88;
  TypeBuilder local_18 [8];
  TypeBuilder builder;
  Fuzzer *this_local;
  
  _builder = this;
  sVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&this->types);
  wasm::TypeBuilder::TypeBuilder(local_18,sVar5);
  checkCanonicalization()::Copier::Copier(wasm::Fuzzer&,wasm::TypeBuilder__(&local_88,this,local_18)
  ;
  checkCanonicalization::Copier::~Copier(&local_88);
  wasm::TypeBuilder::build();
  print.names._M_h._M_single_bucket =
       (__node_base_ptr)TypeBuilder::BuildResult::getError((BuildResult *)&error);
  if ((Error *)print.names._M_h._M_single_bucket != (Error *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"",&local_179);
    IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
    IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
              ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_158,&this->types,
               &local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    Fatal::Fatal((Fatal *)&newTypes.
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    pFVar6 = Fatal::operator<<((Fatal *)&newTypes.
                                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (char (*) [38])"Failed to build copies of the types: ");
    pFVar6 = Fatal::operator<<(pFVar6,(ErrorReason *)(print.names._M_h._M_single_bucket + 1));
    pFVar6 = Fatal::operator<<(pFVar6,(char (*) [11])0x2e7923);
    Fatal::operator<<(pFVar6,(unsigned_long *)print.names._M_h._M_single_bucket);
    Fatal::~Fatal((Fatal *)&newTypes.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  __x = TypeBuilder::BuildResult::operator*((BuildResult *)&error);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&i,__x);
  sVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&this->types);
  sVar7 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&i);
  if (sVar5 == sVar7) {
    print_1.names._M_h._M_single_bucket = (__node_base_ptr)0x0;
    while( true ) {
      p_Var3 = print_1.names._M_h._M_single_bucket;
      p_Var8 = (__node_base_ptr)
               std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&this->types);
      if (p_Var8 <= p_Var3) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&i);
        TypeBuilder::BuildResult::~BuildResult((BuildResult *)&error);
        wasm::TypeBuilder::~TypeBuilder(local_18);
        return;
      }
      pvVar9 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         (&this->types,(size_type)print_1.names._M_h._M_single_bucket);
      other = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&i,
                         (size_type)print_1.names._M_h._M_single_bucket);
      bVar4 = HeapType::operator!=(pvVar9,other);
      if (bVar4) break;
      print_1.names._M_h._M_single_bucket =
           (__node_base_ptr)((long)&(print_1.names._M_h._M_single_bucket)->_M_nxt + 1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"",(allocator<char> *)((long)&j + 7));
    IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
    IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
              ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)local_3c0,&this->types,
               &local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&j + 7));
    std::operator<<((ostream *)&std::cerr,"\n");
    local_3f0 = 0;
    while( true ) {
      uVar2 = local_3f0;
      sVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&i);
      if (sVar5 <= uVar2) break;
      poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,local_3f0);
      poVar10 = std::operator<<(poVar10,": ");
      pvVar9 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&i,local_3f0);
      local_420 = pvVar9->id;
      TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
      operator()(&local_418,
                 (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                  *)local_3c0,(HeapType)local_420);
      PVar1.generateName.super__Function_base._M_functor._M_unused._M_object =
           (void *)in_stack_fffffffffffff920;
      PVar1.typeID = in_stack_fffffffffffff918;
      PVar1.generateName.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffff928;
      PVar1.generateName.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffff930;
      PVar1.generateName._M_invoker = in_stack_fffffffffffff938;
      poVar10 = (ostream *)wasm::operator<<(poVar10,PVar1);
      std::operator<<(poVar10,"\n");
      HeapType::Printed::~Printed(&local_418);
      local_3f0 = local_3f0 + 1;
    }
    Fatal::Fatal(&local_5a8);
    pFVar6 = Fatal::operator<<(&local_5a8,(char (*) [23])"Copy of type at index ");
    pFVar6 = Fatal::operator<<(pFVar6,(unsigned_long *)&print_1.names._M_h._M_single_bucket);
    pFVar6 = Fatal::operator<<(pFVar6,(char (*) [15])" is distinct:\n");
    pFVar6 = Fatal::operator<<(pFVar6,(char (*) [11])"original: ");
    pvVar9 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       (&this->types,(size_type)print_1.names._M_h._M_single_bucket);
    local_5d8 = pvVar9->id;
    TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
    operator()(&local_5d0,
               (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                *)local_3c0,(HeapType)local_5d8);
    pFVar6 = Fatal::operator<<(pFVar6,&local_5d0);
    local_5d9 = '\n';
    pFVar6 = Fatal::operator<<(pFVar6,&local_5d9);
    pFVar6 = Fatal::operator<<(pFVar6,(char (*) [11])"copy:     ");
    pvVar9 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&i,
                        (size_type)print_1.names._M_h._M_single_bucket);
    TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
    operator()(&local_608,
               (TypeNameGeneratorBase<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                *)local_3c0,(HeapType)pvVar9->id);
    Fatal::operator<<(pFVar6,&local_608);
    HeapType::Printed::~Printed(&local_608);
    HeapType::Printed::~Printed(&local_5d0);
    Fatal::~Fatal(&local_5a8);
  }
  __assert_fail("types.size() == newTypes.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-types.cpp"
                ,0x1d2,"void wasm::Fuzzer::checkCanonicalization()");
}

Assistant:

void Fuzzer::checkCanonicalization() {
  // Check that structural canonicalization is working correctly by building the
  // types again, choosing randomly between equivalent possible children for
  // each definition from both the new and old sets of built types.
  TypeBuilder builder(types.size());

  // Helper for creating new definitions of existing types, randomly choosing
  // between canonical and temporary components.
  struct Copier {
    Random& rand;
    const std::vector<HeapType>& types;
    TypeBuilder& builder;

    // For each type, the indices in `types` at which it appears.
    std::unordered_map<HeapType, std::vector<Index>> typeIndices;

    // For each type, the index one past the end of its rec group, or
    // alternatively the cumulative size of its rec group and previous rec
    // groups.
    std::vector<Index> recGroupEnds;

    // The index of the type we are currently building.
    Index index = 0;

    Copier(Fuzzer& parent, TypeBuilder& builder)
      : rand(parent.rand), types(parent.types), builder(builder) {
      // Set the type indices
      for (size_t i = 0; i < types.size(); ++i) {
        typeIndices[types[i]].push_back(i);
      }

      // Set supertypes
      // TODO: support setting old canonical types as the supertypes.
      const auto& subtypeIndices = parent.subtypeIndices;
      for (size_t super = 0; super < subtypeIndices.size(); ++super) {
        for (auto sub : subtypeIndices[super]) {
          if (sub != super) {
            builder[sub].subTypeOf(builder[super]);
          }
        }
      }

      // Set finality and shareability
      for (size_t i = 0; i < types.size(); ++i) {
        builder[i].setOpen(types[i].isOpen());
        builder[i].setShared(types[i].getShared());
      }

      // Set up recursion groups and record group ends to ensure we only select
      // valid children.
      recGroupEnds.reserve(builder.size());
      // Set up recursion groups
      std::optional<RecGroup> currGroup;
      size_t currGroupStart = 0;
      auto finishGroup = [&](Index end) {
        builder.createRecGroup(currGroupStart, end - currGroupStart);
        for (Index i = currGroupStart; i < end; ++i) {
          recGroupEnds.push_back(end);
        }
        currGroupStart = end;
      };
      for (Index i = 0; i < types.size(); ++i) {
        auto newGroup = types[i].getRecGroup();
        if (!currGroup || newGroup != currGroup ||
            types[i] == types[currGroupStart]) {
          finishGroup(i);
          currGroup = newGroup;
        }
      }
      finishGroup(builder.size());

      // Copy the original types
      for (; index < types.size(); ++index) {
        auto type = types[index];
        switch (type.getKind()) {
          case HeapTypeKind::Func:
            builder[index] = getSignature(type.getSignature());
            continue;
          case HeapTypeKind::Struct:
            builder[index] = getStruct(type.getStruct());
            continue;
          case HeapTypeKind::Array:
            builder[index] = getArray(type.getArray());
            continue;
          case HeapTypeKind::Cont:
            WASM_UNREACHABLE("TODO: cont");
          case HeapTypeKind::Basic:
            break;
        }
        WASM_UNREACHABLE("unexpected type kind");
      }
    }

    struct NewHeapType : HeapType {};
    struct OldHeapType : HeapType {};
    struct CopiedHeapType {
      std::variant<NewHeapType, OldHeapType> type;
      NewHeapType* getNew() { return std::get_if<NewHeapType>(&type); }
      OldHeapType* getOld() { return std::get_if<OldHeapType>(&type); }
      HeapType get() {
        return getNew() ? HeapType(*getNew()) : HeapType(*getOld());
      }
    };

    struct NewType : Type {};
    struct OldType : Type {};
    struct CopiedType {
      std::variant<NewType, OldType> type;
      NewType* getNew() { return std::get_if<NewType>(&type); }
      OldType* getOld() { return std::get_if<OldType>(&type); }
      Type get() { return getNew() ? Type(*getNew()) : Type(*getOld()); }
    };

    CopiedHeapType getChildHeapType(HeapType old) {
      auto it = typeIndices.find(old);
      if (it == typeIndices.end()) {
        // This is a basic heap type and wasn't explicitly built.
        assert(old.isBasic());
        return {OldHeapType{old}};
      }
      assert(!old.isBasic());
      // Check whether this child heap type is supposed to be a self-reference
      // into the recursion group we are defining. If it is, we must use the
      // corresponding type in the new recursion group, since anything else
      // would break isorecursive equivalence.
      auto group = old.getRecGroup();
      if (group == types[index].getRecGroup()) {
        // This is a self-reference, so find the correct index, which is the
        // last matching index less than the end of this rec group.
        std::optional<Index> i;
        for (auto candidate : it->second) {
          if (candidate >= recGroupEnds[index]) {
            break;
          }
          i = candidate;
        }
        return {NewHeapType{builder[*i]}};
      }
      // Choose whether to use an old type or a new type
      if (rand.oneIn(2)) {
        // Using a copied heap type; filter out invalid candidates.
        // Filter out invalid candidates.
        std::vector<Index> candidateIndices;
        for (auto i : it->second) {
          if (i < recGroupEnds[index]) {
            candidateIndices.push_back(i);
          }
        }
        assert(!candidateIndices.empty());
        Index i = rand.pick(candidateIndices);
        return {NewHeapType{builder[i]}};
      } else {
        // Using an original heap type.
        Index i = rand.pick(it->second);
        return {OldHeapType{types[i]}};
      }
    }

    CopiedType getTuple(Type old) {
      TypeList types;
      types.reserve(old.size());
      bool hasTempChild = false;
      for (auto type : old) {
        auto copied = getType(type);
        if (copied.getNew()) {
          hasTempChild = true;
        }
        types.push_back(copied.get());
      }
      // Must use a temporary type if we have a temporary child, otherwise we
      // can choose.
      if (hasTempChild || rand.oneIn(2)) {
        return {NewType{builder.getTempTupleType(types)}};
      } else {
        return {OldType{Tuple(std::move(types))}};
      }
    }

    CopiedType getRef(Type old) {
      auto copied = getChildHeapType(old.getHeapType());
      auto type = copied.get();
      auto nullability = old.getNullability();
      if (copied.getNew()) {
        // The child is temporary, so we must put it in a temporary type.
        return {NewType{builder.getTempRefType(type, nullability)}};
      } else {
        // The child is canonical, so we can either put it in a temporary type
        // or use the canonical type.
        if (rand.oneIn(2)) {
          return {NewType{builder.getTempRefType(type, nullability)}};
        } else {
          return {OldType{Type(type, nullability)}};
        }
      }
    }

    CopiedType getType(Type old) {
      if (old.isTuple()) {
        return getTuple(old);
      } else if (old.isRef()) {
        return getRef(old);
      } else {
        assert(old.isBasic());
        return {OldType{old}};
      }
    }

    Field getField(Field old) {
      old.type = getType(old.type).get();
      return old;
    }

    Signature getSignature(Signature old) {
      return {getType(old.params).get(), getType(old.results).get()};
    }

    Struct getStruct(const Struct& old) {
      FieldList fields;
      fields.reserve(old.fields.size());
      for (const auto& field : old.fields) {
        fields.push_back(getField(field));
      }
      return {std::move(fields)};
    }

    Array getArray(Array old) {
      old.element = getField(old.element);
      return old;
    }
  };

  Copier{*this, builder};

  auto result = builder.build();
  if (auto* error = result.getError()) {
    IndexedTypeNameGenerator print(types);
    Fatal() << "Failed to build copies of the types: " << error->reason
            << " at index " << error->index;
  }
  auto newTypes = *result;
  assert(types.size() == newTypes.size());
  for (size_t i = 0; i < types.size(); ++i) {
    if (types[i] != newTypes[i]) {
      IndexedTypeNameGenerator print(types);
      std::cerr << "\n";
      for (size_t j = 0; j < newTypes.size(); ++j) {
        std::cerr << j << ": " << print(newTypes[j]) << "\n";
      }
      Fatal() << "Copy of type at index " << i << " is distinct:\n"
              << "original: " << print(types[i]) << '\n'
              << "copy:     " << print(newTypes[i]);
    }
  }
}